

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O1

REF_STATUS
ref_face_open_node(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz3,REF_INT *open_node,
                  REF_DBL *dot)

{
  REF_DBL *pRVar1;
  double *pdVar2;
  uint uVar3;
  double dVar4;
  REF_DBL edge2 [3];
  REF_DBL edge1 [3];
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double *local_48;
  REF_DBL *local_40;
  double *local_38;
  
  local_68 = *xyz0 - *xyz3;
  local_60 = xyz0[1] - xyz3[1];
  local_58 = xyz0[2] - xyz3[2];
  local_88 = *xyz1 - *xyz0;
  local_80 = xyz1[1] - xyz0[1];
  local_78 = xyz1[2] - xyz0[2];
  local_40 = dot;
  uVar3 = ref_math_normalize(&local_68);
  if (uVar3 == 0) {
    local_48 = xyz0;
    local_38 = xyz1;
    uVar3 = ref_math_normalize(&local_88);
    pdVar2 = local_38;
    if (uVar3 == 0) {
      local_70 = local_78 * local_58 + local_88 * local_68 + local_80 * local_60;
      *open_node = 0;
      *local_40 = local_70;
      local_68 = *local_38 - *local_48;
      local_60 = local_38[1] - local_48[1];
      local_58 = local_38[2] - local_48[2];
      local_88 = *xyz2 - *local_38;
      local_80 = xyz2[1] - local_38[1];
      local_78 = xyz2[2] - local_38[2];
      uVar3 = ref_math_normalize(&local_68);
      if (uVar3 == 0) {
        uVar3 = ref_math_normalize(&local_88);
        pRVar1 = local_40;
        if (uVar3 == 0) {
          dVar4 = local_78 * local_58 + local_88 * local_68 + local_80 * local_60;
          if (local_70 < dVar4) {
            *open_node = 1;
            *local_40 = dVar4;
            local_70 = dVar4;
          }
          local_68 = *xyz2 - *pdVar2;
          local_60 = xyz2[1] - pdVar2[1];
          local_58 = xyz2[2] - pdVar2[2];
          local_88 = *xyz3 - *xyz2;
          local_80 = xyz3[1] - xyz2[1];
          local_78 = xyz3[2] - xyz2[2];
          uVar3 = ref_math_normalize(&local_68);
          if (uVar3 == 0) {
            uVar3 = ref_math_normalize(&local_88);
            if (uVar3 == 0) {
              dVar4 = local_78 * local_58 + local_88 * local_68 + local_80 * local_60;
              if (local_70 < dVar4) {
                *open_node = 2;
                *pRVar1 = dVar4;
                local_70 = dVar4;
              }
              local_68 = *xyz3 - *xyz2;
              local_60 = xyz3[1] - xyz2[1];
              local_58 = xyz3[2] - xyz2[2];
              local_88 = *local_48 - *xyz3;
              local_80 = local_48[1] - xyz3[1];
              local_78 = local_48[2] - xyz3[2];
              uVar3 = ref_math_normalize(&local_68);
              if (uVar3 == 0) {
                uVar3 = ref_math_normalize(&local_88);
                if (uVar3 == 0) {
                  dVar4 = local_78 * local_58 + local_88 * local_68 + local_80 * local_60;
                  uVar3 = 0;
                  if (local_70 < dVar4) {
                    *open_node = 3;
                    *pRVar1 = dVar4;
                    uVar3 = 0;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c"
                         ,0x132,"ref_face_open_node",(ulong)uVar3,"e2");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c"
                       ,0x131,"ref_face_open_node",(ulong)uVar3,"e1");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c"
                     ,0x122,"ref_face_open_node",(ulong)uVar3,"e2");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                   0x121,"ref_face_open_node",(ulong)uVar3,"e1");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 0x112,"ref_face_open_node",(ulong)uVar3,"e2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
               0x111,"ref_face_open_node",(ulong)uVar3,"e1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x104,
             "ref_face_open_node",(ulong)uVar3,"e2");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x103,
           "ref_face_open_node",(ulong)uVar3,"e1");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_face_open_node(REF_DBL *xyz0, REF_DBL *xyz1,
                                      REF_DBL *xyz2, REF_DBL *xyz3,
                                      REF_INT *open_node, REF_DBL *dot) {
  REF_DBL edge1[3], edge2[3];
  REF_DBL open_dot;

  edge1[0] = xyz0[0] - xyz3[0];
  edge1[1] = xyz0[1] - xyz3[1];
  edge1[2] = xyz0[2] - xyz3[2];

  edge2[0] = xyz1[0] - xyz0[0];
  edge2[1] = xyz1[1] - xyz0[1];
  edge2[2] = xyz1[2] - xyz0[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  open_dot = ref_math_dot(edge2, edge1);
  *open_node = 0;
  *dot = open_dot;

  edge1[0] = xyz1[0] - xyz0[0];
  edge1[1] = xyz1[1] - xyz0[1];
  edge1[2] = xyz1[2] - xyz0[2];

  edge2[0] = xyz2[0] - xyz1[0];
  edge2[1] = xyz2[1] - xyz1[1];
  edge2[2] = xyz2[2] - xyz1[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  if (ref_math_dot(edge2, edge1) > open_dot) {
    open_dot = ref_math_dot(edge2, edge1);
    *open_node = 1;
    *dot = open_dot;
  }

  edge1[0] = xyz2[0] - xyz1[0];
  edge1[1] = xyz2[1] - xyz1[1];
  edge1[2] = xyz2[2] - xyz1[2];

  edge2[0] = xyz3[0] - xyz2[0];
  edge2[1] = xyz3[1] - xyz2[1];
  edge2[2] = xyz3[2] - xyz2[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  if (ref_math_dot(edge2, edge1) > open_dot) {
    open_dot = ref_math_dot(edge2, edge1);
    *open_node = 2;
    *dot = open_dot;
  }

  edge1[0] = xyz3[0] - xyz2[0];
  edge1[1] = xyz3[1] - xyz2[1];
  edge1[2] = xyz3[2] - xyz2[2];

  edge2[0] = xyz0[0] - xyz3[0];
  edge2[1] = xyz0[1] - xyz3[1];
  edge2[2] = xyz0[2] - xyz3[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  if (ref_math_dot(edge2, edge1) > open_dot) {
    open_dot = ref_math_dot(edge2, edge1);
    *open_node = 3;
    *dot = open_dot;
  }

  return REF_SUCCESS;
}